

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

void __thiscall
glslang::TReflectionTraverser::addUniform(TReflectionTraverser *this,TIntermSymbol *base)

{
  _Rb_tree_header *p_Var1;
  _List_node_header *deref;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  int offset;
  TString baseName;
  TList<glslang::TIntermBinary_*> derefs;
  
  p_Var1 = &(this->processedDerefs)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (this->processedDerefs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0;
      p_Var7 = (&p_Var7->_M_left)[*(TIntermSymbol **)(p_Var7 + 1) < base]) {
    if (*(TIntermSymbol **)(p_Var7 + 1) >= base) {
      p_Var6 = p_Var7;
    }
  }
  p_Var7 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (p_Var7 = p_Var6, base < *(TIntermSymbol **)(p_Var6 + 1))) {
    p_Var7 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var7 == p_Var1) {
    baseName._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)base;
    std::
    _Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
    ::_M_insert_unique<TIntermNode_const*>
              ((_Rb_tree<TIntermNode_const*,TIntermNode_const*,std::_Identity<TIntermNode_const*>,std::less<TIntermNode_const*>,std::allocator<TIntermNode_const*>>
                *)&this->processedDerefs,(TIntermNode **)&baseName);
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl.super__Node_alloc_type.allocator = GetThreadPoolAllocator();
    deref = &derefs.
             super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
             .
             super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>
             ._M_impl._M_node;
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node._M_size = 0;
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = &deref->super__List_node_base;
    derefs.super_list<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    super__List_base<glslang::TIntermBinary_*,_glslang::pool_allocator<glslang::TIntermBinary_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = &deref->super__List_node_base;
    iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(base);
    baseName._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
    lVar2 = *(long *)(CONCAT44(extraout_var,iVar3) + 8);
    baseName._M_dataplus._M_p = (pointer)&baseName.field_2;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char*>((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                        &baseName,lVar2,*(long *)(CONCAT44(extraout_var,iVar3) + 0x10) + lVar2);
    iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
    iVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x38))
                      ((long *)CONCAT44(extraout_var_00,iVar3));
    offset = -1;
    iVar4 = -1;
    if (iVar3 == 0x10) {
      iVar3 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (&baseName,0,5,"anon@");
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
      __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
              (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar4) + 0x28))
                        ((long *)CONCAT44(extraout_var_01,iVar4));
      if (iVar3 == 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_replace(&baseName,0,baseName._M_string_length,"",0);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        _M_assign(&baseName,__str);
      }
      iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
      iVar4 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
      iVar4 = TIntermediate::getBlockSize((TType *)CONCAT44(extraout_var_03,iVar4));
      iVar4 = addBlockName(this,__str,(TType *)CONCAT44(extraout_var_02,iVar3),iVar4);
      offset = 0;
    }
    iVar3 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(base);
    iVar5 = (*(base->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x22])(base);
    blowUpActiveAggregate
              (this,(TType *)CONCAT44(extraout_var_04,iVar3),&baseName,&derefs,(const_iterator)deref
               ,offset,iVar4,0,-1,0,
               *(TStorageQualifier *)(CONCAT44(extraout_var_05,iVar5) + 8) & 0x7f,
               this->updateStageMasks);
  }
  return;
}

Assistant:

void addUniform(const TIntermSymbol& base)
    {
        if (processedDerefs.find(&base) == processedDerefs.end()) {
            processedDerefs.insert(&base);

            int blockIndex = -1;
            int offset     = -1;
            TList<TIntermBinary*> derefs;
            TString baseName = base.getName();

            if (base.getType().getBasicType() == EbtBlock) {
                offset = 0;
                bool anonymous = IsAnonymous(baseName);
                const TString& blockName = base.getType().getTypeName();

                if (!anonymous)
                    baseName = blockName;
                else
                    baseName = "";

                blockIndex = addBlockName(blockName, base.getType(), intermediate.getBlockSize(base.getType()));
            }

            // Use a degenerate (empty) set of dereferences to immediately put as at the end of
            // the dereference change expected by blowUpActiveAggregate.
            blowUpActiveAggregate(base.getType(), baseName, derefs, derefs.end(), offset, blockIndex, 0, -1, 0,
                                    base.getQualifier().storage, updateStageMasks);
        }
    }